

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
testing::internal2::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,unique_ptr<Struct2> *x)

{
  long lVar1;
  long in_FS_OFFSET;
  unique_ptr<Struct2> *x_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TypeWithoutFormatter<unique_ptr<Struct2>,_(testing::internal2::TypeKind)1>::PrintValue(x,os);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return os;
  }
  __stack_chk_fail();
}

Assistant:

::std::basic_ostream<Char, CharTraits>& operator<<(
    ::std::basic_ostream<Char, CharTraits>& os, const T& x) {
  TypeWithoutFormatter<T, (internal::IsAProtocolMessage<T>::value
                               ? kProtobuf
                               : internal::ImplicitlyConvertible<
                                     const T&, internal::BiggestInt>::value
                                     ? kConvertibleToInteger
                                     :
#if GTEST_HAS_ABSL
                                     internal::ImplicitlyConvertible<
                                         const T&, absl::string_view>::value
                                         ? kConvertibleToStringView
                                         :
#endif
                                         kOtherType)>::PrintValue(x, &os);
  return os;
}